

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::Continent::Continent(Continent *this,string *cname,int troops)

{
  string *this_00;
  int *piVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_01;
  int troops_local;
  string *cname_local;
  Continent *this_local;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)cname);
  this->pCName = this_00;
  piVar1 = (int *)operator_new(4);
  *piVar1 = troops;
  this->pCTroops = piVar1;
  this_01 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector(this_01);
  this->pCountriesInContinent = this_01;
  return;
}

Assistant:

Map::Continent::Continent(std::string cname, int troops) {
    pCName = new std::string(std::move(cname));
    pCTroops = new int(troops);
    pCountriesInContinent = new std::vector<Country*>;
}